

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O0

uint32_t memory_tree_ns::compute_hamming_loss_via_oas
                   (memory_tree *b,single_learner *base,uint32_t cn,example *ec,
                   v_array<unsigned_int> *selected_labs)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint32_t uVar9;
  size_t sVar10;
  long in_RCX;
  v_array<unsigned_int> *in_RSI;
  long in_RDI;
  v_array<unsigned_int> *in_R8;
  float score;
  size_t i;
  labels preds;
  labels multilabels;
  v_array<unsigned_int> leaf_labs;
  uint *in_stack_ffffffffffffff28;
  v_array<unsigned_int> *in_stack_ffffffffffffff30;
  example *in_stack_ffffffffffffff38;
  v_array<unsigned_int> *in_stack_ffffffffffffff40;
  v_array<unsigned_int> *in_stack_ffffffffffffff60;
  ulong uVar11;
  ulong i_00;
  uint32_t in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  v_array<unsigned_int> local_48;
  v_array<unsigned_int> *local_28;
  long local_20;
  v_array<unsigned_int> *local_10;
  long local_8;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  v_array<unsigned_int>::delete_v(in_stack_ffffffffffffff30);
  v_init<unsigned_int>();
  collect_labels_from_leaf
            ((memory_tree *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60);
  uVar1 = *(undefined8 *)(local_20 + 0x6828);
  uVar2 = *(undefined8 *)(local_20 + 0x6830);
  uVar3 = *(undefined8 *)(local_20 + 0x6838);
  uVar4 = *(undefined8 *)(local_20 + 0x6840);
  uVar5 = *(undefined8 *)(local_20 + 0x6850);
  uVar6 = *(undefined8 *)(local_20 + 0x6858);
  uVar7 = *(undefined8 *)(local_20 + 0x6860);
  uVar8 = *(undefined8 *)(local_20 + 0x6868);
  *(undefined8 *)(local_20 + 0x6828) = 0x3f8000007f7fffff;
  *(undefined4 *)(local_20 + 0x6830) = 0;
  uVar11 = 0;
  while( true ) {
    i_00 = uVar11;
    sVar10 = v_array<unsigned_int>::size(&local_48);
    if (sVar10 <= uVar11) break;
    in_stack_ffffffffffffff38 = (example *)(*(long *)(local_8 + 0x60) + 1);
    in_stack_ffffffffffffff40 = local_10;
    v_array<unsigned_int>::operator[](&local_48,i_00);
    LEARNER::learner<char,_example>::predict
              ((learner<char,_example> *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
               (size_t)in_stack_ffffffffffffff30);
    if (0.0 < *(float *)(local_20 + 0x6850)) {
      in_stack_ffffffffffffff30 = local_28;
      v_array<unsigned_int>::operator[](&local_48,i_00);
      v_array<unsigned_int>::push_back(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    }
    uVar11 = i_00 + 1;
  }
  *(undefined8 *)(local_20 + 0x6850) = uVar5;
  *(undefined8 *)(local_20 + 0x6858) = uVar6;
  *(undefined8 *)(local_20 + 0x6860) = uVar7;
  *(undefined8 *)(local_20 + 0x6868) = uVar8;
  *(undefined8 *)(local_20 + 0x6828) = uVar1;
  *(undefined8 *)(local_20 + 0x6830) = uVar2;
  *(undefined8 *)(local_20 + 0x6838) = uVar3;
  *(undefined8 *)(local_20 + 0x6840) = uVar4;
  uVar9 = hamming_loss(in_stack_ffffffffffffff40,(v_array<unsigned_int> *)in_stack_ffffffffffffff38)
  ;
  return uVar9;
}

Assistant:

inline uint32_t compute_hamming_loss_via_oas(memory_tree& b, single_learner& base, 
		    const uint32_t cn, example& ec, v_array<uint32_t>& selected_labs)
    {
	    selected_labs.delete_v();
    	v_array<uint32_t> leaf_labs = v_init<uint32_t>();
	    collect_labels_from_leaf(b, cn, leaf_labs); //unique labels stored in the leaf.
	    MULTILABEL::labels multilabels = ec.l.multilabels;
	    MULTILABEL::labels preds = ec.pred.multilabels;
	    ec.l.simple = {FLT_MAX, 1.f, 0.f};
	    for (size_t i = 0; i < leaf_labs.size(); i++){
		    base.predict(ec, b.max_routers + 1 + leaf_labs[i]);
		    float score = ec.pred.scalar;
		    if (score > 0)
			    selected_labs.push_back(leaf_labs[i]);
	    }
	    ec.pred.multilabels = preds;
	    ec.l.multilabels = multilabels;

	    return hamming_loss(ec.l.multilabels.label_v, selected_labs);
    }